

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float4 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  size_type sVar4;
  Property *pPVar5;
  mapped_type *this;
  ostream *poVar6;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff0e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0 [32];
  string local_e90 [32];
  ostringstream local_e70 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8 [39];
  allocator local_ca1;
  string local_ca0 [32];
  string local_c80;
  ostringstream local_c60 [8];
  ostringstream ss_e_3;
  allocator local_ae1;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [40];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58 [39];
  allocator local_a31;
  string local_a30 [32];
  fmt local_a10 [32];
  ostringstream local_9f0 [8];
  ostringstream ss_e_2;
  allocator local_871;
  undefined1 local_870 [32];
  undefined1 local_850 [40];
  ParseResult sret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8 [32];
  ostringstream local_7c8 [8];
  ostringstream ss_e_1;
  allocator local_649;
  string local_648;
  string local_628;
  undefined1 local_608 [8];
  ParseResult ret_1;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> tok_attr;
  key_type local_358 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0;
  ostringstream local_2b0 [8];
  ostringstream ss_e;
  int local_138;
  allocator local_131;
  undefined1 local_130 [32];
  undefined1 local_110 [40];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  allocator local_91;
  value_type local_90 [4];
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  UsdPrimvarReader_float4 *preader_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_90,"info:id",&local_91);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,local_90);
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_110,(string *)ret.err.field_2._8_8_);
    psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_130,"inputs:fallback",&local_131);
    pPVar5 = (Property *)local_130;
    (anonymous_namespace)::ParseTypedAttribute<std::array<float,4ul>>
              ((ParseResult *)(local_110 + 0x20),(_anonymous_namespace_ *)local_70,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_110,psVar3,pPVar5,(string *)&preader->fallback,
               (TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)
               in_stack_fffffffffffff0e8);
    ::std::__cxx11::string::~string((string *)local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    ::std::__cxx11::string::~string((string *)local_110);
    if ((local_110._32_4_ == 0) || (local_110._32_4_ == 2)) {
      local_138 = 3;
    }
    else if (local_110._32_4_ == 1) {
      local_138 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_2b0);
      poVar6 = ::std::operator<<((ostream *)local_2b0,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x10f2);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2f0,"Parsing attribute `{}` failed. Error: {}",&local_2f1);
      fmt::format<char[16],std::__cxx11::string>
                (&local_2d0,(fmt *)local_2f0,(string *)"inputs:fallback",(char (*) [16])&ret,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
      poVar6 = ::std::operator<<((ostream *)local_2b0,(string *)&local_2d0);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)&local_2d0);
      ::std::__cxx11::string::~string(local_2f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_318,local_338);
        ::std::__cxx11::string::operator=
                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)local_318);
        ::std::__cxx11::string::~string((string *)local_318);
        ::std::__cxx11::string::~string((string *)local_338);
      }
      spec_local._7_1_ = 0;
      local_138 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2b0);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_110 + 0x20));
    if (local_138 == 0) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )ret.err.field_2._8_8_,"inputs:varname");
      tok_attr._638_1_ = 0;
      tok_attr._637_1_ = 0;
      bVar1 = false;
      if (bVar2) {
        ::std::allocator<char>::allocator();
        tok_attr._638_1_ = 1;
        ::std::__cxx11::string::string
                  ((string *)local_358,"inputs:varname",(allocator *)&tok_attr.field_0x27f);
        tok_attr._637_1_ = 1;
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,local_358);
        bVar1 = sVar4 == 0;
      }
      if ((tok_attr._637_1_ & 1) != 0) {
        ::std::__cxx11::string::~string((string *)local_358);
      }
      if ((tok_attr._638_1_ & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&tok_attr.field_0x27f);
      }
      if (bVar1) {
        TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                   ((long)&ret_1.err.field_2 + 8));
        ::std::__cxx11::string::string((string *)&local_628,(string *)ret.err.field_2._8_8_);
        pPVar5 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_648,"inputs:varname",&local_649);
        anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                  ((ParseResult *)local_608,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_628,pPVar5,&local_648,
                   (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                   ((long)&ret_1.err.field_2 + 8));
        ::std::__cxx11::string::~string((string *)&local_648);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_649);
        ::std::__cxx11::string::~string((string *)&local_628);
        if (local_608._0_4_ == _S_red) {
          bVar1 = ConvertTokenAttributeToStringAttribute
                            ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                             ((long)&ret_1.err.field_2 + 8),&preader->varname);
          if (bVar1) {
            local_138 = 3;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_7c8);
            poVar6 = ::std::operator<<((ostream *)local_7c8,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x10f9);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)local_7c8,
                                       "Failed to convert inputs:varname token type to string type."
                                      );
            ::std::operator<<(poVar6,"\n");
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_7e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (sret.err.field_2._M_local_buf + 8));
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_7e8);
              ::std::__cxx11::string::~string((string *)local_7e8);
              ::std::__cxx11::string::~string((string *)(sret.err.field_2._M_local_buf + 8));
            }
            spec_local._7_1_ = 0;
            local_138 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_7c8);
          }
        }
        else {
          if (local_608._0_4_ == 3) {
            ::std::__cxx11::string::string((string *)local_850,(string *)ret.err.field_2._8_8_);
            psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_870,"inputs:varname",&local_871);
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)(local_850 + 0x20),(_anonymous_namespace_ *)local_70,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_850,psVar3,(Property *)local_870,(string *)&preader->varname,
                       in_stack_fffffffffffff0e8);
            ::std::__cxx11::string::~string((string *)local_870);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_871);
            ::std::__cxx11::string::~string((string *)local_850);
            if (local_850._32_4_ == 0) {
              local_138 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_9f0);
              poVar6 = ::std::operator<<((ostream *)local_9f0,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x110b);
              ::std::operator<<(poVar6," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_a30,"Faied to parse inputs:varname: {}",&local_a31);
              fmt::format<std::__cxx11::string>
                        (local_a10,(string *)local_a30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sret)
              ;
              poVar6 = ::std::operator<<((ostream *)local_9f0,(string *)local_a10);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::~string((string *)local_a10);
              ::std::__cxx11::string::~string(local_a30);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_a31);
              if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_a58,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(ret_2.err.field_2._M_local_buf + 8));
                ::std::__cxx11::string::operator=
                          ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (string *)local_a58);
                ::std::__cxx11::string::~string((string *)local_a58);
                ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
              }
              spec_local._7_1_ = 0;
              local_138 = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_9f0);
            }
            anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_850 + 0x20));
            if (local_138 != 0) goto LAB_002df5e9;
          }
          local_138 = 0;
        }
LAB_002df5e9:
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_608);
        TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                   ((long)&ret_1.err.field_2 + 8));
        if (local_138 != 0) goto joined_r0x002df61c;
      }
      ::std::__cxx11::string::string((string *)local_ac0,(string *)ret.err.field_2._8_8_);
      psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_ae0,"outputs:result",&local_ae1);
      pPVar5 = (Property *)local_ae0;
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,4ul>>
                ((ParseResult *)(local_ac0 + 0x20),(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ac0,psVar3,pPVar5,(string *)&preader->result,
                 (TypedTerminalAttribute<std::array<float,_4UL>_> *)in_stack_fffffffffffff0e8);
      ::std::__cxx11::string::~string((string *)local_ae0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      ::std::__cxx11::string::~string((string *)local_ac0);
      if ((local_ac0._32_4_ == 0) || (local_ac0._32_4_ == 2)) {
        local_138 = 3;
      }
      else if (local_ac0._32_4_ == 1) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c60);
        poVar6 = ::std::operator<<((ostream *)local_c60,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1111);
        ::std::operator<<(poVar6," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_ca0,"Parsing shader output property `{}` failed. Error: {}",&local_ca1);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_c80,(fmt *)local_ca0,(string *)"outputs:result",(char (*) [15])&ret_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
        poVar6 = ::std::operator<<((ostream *)local_c60,(string *)&local_c80);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string((string *)&local_c80);
        ::std::__cxx11::string::~string(local_ca0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_cc8,local_ce8);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_cc8);
          ::std::__cxx11::string::~string((string *)local_cc8);
          ::std::__cxx11::string::~string((string *)local_ce8);
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c60);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_ac0 + 0x20));
      if (local_138 != 0) goto joined_r0x002df61c;
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar4 == 0) {
        pPVar5 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,
                            (key_type *)ret.err.field_2._8_8_);
        Property::operator=(this,pPVar5);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(value_type *)ret.err.field_2._8_8_);
      }
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_e70);
        poVar6 = ::std::operator<<((ostream *)local_e70,"[warn]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1113);
        ::std::operator<<(poVar6," ");
        ::std::operator+((char *)local_e90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar6 = ::std::operator<<((ostream *)local_e70,local_e90);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string(local_e90);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_eb0,local_ed0);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_eb0);
          ::std::__cxx11::string::~string((string *)local_eb0);
          ::std::__cxx11::string::~string((string *)local_ed0);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_e70);
      }
    }
    else {
joined_r0x002df61c:
      if (local_138 != 3) goto LAB_002dfa84;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
LAB_002dfa84:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float4>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float4 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float4,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float4, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float4, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}